

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_getattributes(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  SQClass *this;
  bool bVar2;
  SQObjectPtr *key;
  SQRESULT SVar3;
  SQObjectPtr attrs;
  SQObjectPtr *o;
  SQObjectPtr local_28;
  SQObjectPtr *local_18;
  
  local_18 = (SQObjectPtr *)0x0;
  bVar2 = sq_aux_gettypedarg(v,idx,OT_CLASS,&local_18);
  if (!bVar2) {
    return -1;
  }
  key = SQVM::GetUp(v,-1);
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_28.super_SQObject._type = OT_NULL;
  this = (local_18->super_SQObject)._unVal.pClass;
  if ((key->super_SQObject)._type == OT_NULL) {
    local_28.super_SQObject._unVal = (SQObjectValue)(this->_attributes).super_SQObject._unVal.pTable
    ;
    local_28.super_SQObject._type = (this->_attributes).super_SQObject._type;
    if ((local_28.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
  }
  else {
    bVar2 = SQClass::GetAttributes(this,key,&local_28);
    if (!bVar2) {
      SVar3 = -1;
      sq_throwerror(v,"wrong index");
      goto LAB_0010be15;
    }
  }
  SQVM::Pop(v);
  SQVM::Push(v,&local_28);
  SVar3 = 0;
LAB_0010be15:
  SQObjectPtr::~SQObjectPtr(&local_28);
  return SVar3;
}

Assistant:

SQRESULT sq_getattributes(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_CLASS,o);
    SQObjectPtr &key = stack_get(v,-1);
    SQObjectPtr attrs;
    if(sq_type(key) == OT_NULL) {
        attrs = _class(*o)->_attributes;
        v->Pop();
        v->Push(attrs);
        return SQ_OK;
    }
    else if(_class(*o)->GetAttributes(key,attrs)) {
        v->Pop();
        v->Push(attrs);
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("wrong index"));
}